

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,long,duckdb::BinaryStandardOperatorWrapper,duckdb::InstrOperator,bool,false,false>
               (string_t *ldata,string_t *rdata,long *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  unsigned_long *puVar1;
  bool bVar2;
  idx_t iVar3;
  utf8proc_ssize_t uVar4;
  ulong uVar5;
  utf8proc_ssize_t len_2;
  idx_t iVar6;
  utf8proc_ssize_t len;
  idx_t iVar7;
  ulong uVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  anon_union_16_2_67f50693_for_value local_a0;
  string_t *local_90;
  string_t *local_88;
  long *local_80;
  utf8proc_int32_t local_74;
  ulong local_70;
  ulong local_68;
  anon_union_16_2_67f50693_for_value local_60;
  ValidityMask *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_90 = ldata;
  local_88 = rdata;
  local_80 = result_data;
  local_68 = count;
  local_50 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar3 = 0;
      do {
        local_a0._0_8_ = *(undefined8 *)&local_90[iVar3].value;
        local_a0.pointer.ptr = local_90[iVar3].value.pointer.ptr;
        local_60._0_8_ = *(undefined8 *)&local_88[iVar3].value;
        local_60.pointer.ptr = local_88[iVar3].value.pointer.ptr;
        iVar7 = FindStrInStr((string_t *)&local_a0.pointer,(string_t *)&local_60.pointer);
        if (iVar7 == 0xffffffffffffffff) {
          lVar13 = 0;
        }
        else if ((long)iVar7 < 1) {
          lVar13 = 1;
        }
        else {
          uVar9 = local_a0.pointer.prefix;
          if (0xc < local_a0.pointer.length) {
            uVar9 = local_a0.pointer.ptr;
          }
          lVar13 = 1;
          do {
            uVar4 = utf8proc_iterate((utf8proc_uint8_t *)uVar9,iVar7,&local_74);
            uVar9 = uVar9 + uVar4;
            lVar13 = lVar13 + 1;
            iVar6 = iVar7 - uVar4;
            bVar2 = uVar4 <= (long)iVar7;
            iVar7 = iVar6;
          } while (iVar6 != 0 && bVar2);
        }
        local_80[iVar3] = lVar13;
        iVar3 = iVar3 + 1;
      } while (iVar3 != local_68);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_70 = count + 0x3f >> 6;
    local_48 = 0;
    uVar10 = 0;
    do {
      puVar1 = (local_50->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar12 = uVar10 + 0x40;
        if (local_68 <= uVar10 + 0x40) {
          uVar12 = local_68;
        }
LAB_01051ad8:
        uVar11 = uVar10;
        if (uVar10 < uVar12) {
          do {
            local_a0._0_8_ = *(undefined8 *)&local_90[uVar10].value;
            local_a0.pointer.ptr = local_90[uVar10].value.pointer.ptr;
            local_60._0_8_ = *(undefined8 *)&local_88[uVar10].value;
            local_60.pointer.ptr = local_88[uVar10].value.pointer.ptr;
            iVar3 = FindStrInStr((string_t *)&local_a0.pointer,(string_t *)&local_60.pointer);
            if (iVar3 == 0xffffffffffffffff) {
              lVar13 = 0;
            }
            else if ((long)iVar3 < 1) {
              lVar13 = 1;
            }
            else {
              uVar9 = local_a0.pointer.prefix;
              if (0xc < local_a0.pointer.length) {
                uVar9 = local_a0.pointer.ptr;
              }
              lVar13 = 1;
              do {
                uVar4 = utf8proc_iterate((utf8proc_uint8_t *)uVar9,iVar3,&local_74);
                uVar9 = uVar9 + uVar4;
                lVar13 = lVar13 + 1;
                iVar7 = iVar3 - uVar4;
                bVar2 = uVar4 <= (long)iVar3;
                iVar3 = iVar7;
              } while (iVar7 != 0 && bVar2);
            }
            local_80[uVar10] = lVar13;
            uVar10 = uVar10 + 1;
            uVar11 = uVar12;
          } while (uVar10 != uVar12);
        }
      }
      else {
        uVar5 = puVar1[local_48];
        uVar12 = uVar10 + 0x40;
        if (local_68 <= uVar10 + 0x40) {
          uVar12 = local_68;
        }
        uVar11 = uVar12;
        if (uVar5 != 0) {
          if (uVar5 == 0xffffffffffffffff) goto LAB_01051ad8;
          uVar8 = uVar10;
          uVar11 = uVar10;
          local_40 = uVar5;
          local_38 = uVar12;
          if (uVar10 < uVar12) {
            do {
              uVar11 = uVar12;
              if ((uVar5 >> ((ulong)(uint)((int)uVar8 - (int)uVar10) & 0x3f) & 1) != 0) {
                local_a0._0_8_ = *(undefined8 *)&local_90[uVar8].value;
                local_a0.pointer.ptr = local_90[uVar8].value.pointer.ptr;
                local_60._0_8_ = *(undefined8 *)&local_88[uVar8].value;
                local_60.pointer.ptr = local_88[uVar8].value.pointer.ptr;
                iVar3 = FindStrInStr((string_t *)&local_a0.pointer,(string_t *)&local_60.pointer);
                if (iVar3 == 0xffffffffffffffff) {
                  lVar13 = 0;
                }
                else if ((long)iVar3 < 1) {
                  lVar13 = 1;
                }
                else {
                  uVar9 = local_a0.pointer.prefix;
                  if (0xc < local_a0.pointer.length) {
                    uVar9 = local_a0.pointer.ptr;
                  }
                  lVar13 = 1;
                  do {
                    uVar4 = utf8proc_iterate((utf8proc_uint8_t *)uVar9,iVar3,&local_74);
                    uVar9 = uVar9 + uVar4;
                    lVar13 = lVar13 + 1;
                    iVar7 = iVar3 - uVar4;
                    bVar2 = uVar4 <= (long)iVar3;
                    iVar3 = iVar7;
                  } while (iVar7 != 0 && bVar2);
                }
                local_80[uVar8] = lVar13;
                uVar5 = local_40;
                uVar11 = local_38;
              }
              uVar8 = uVar8 + 1;
              uVar12 = uVar11;
            } while (uVar8 != uVar11);
          }
        }
      }
      local_48 = local_48 + 1;
      uVar10 = uVar11;
    } while (local_48 != local_70);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}